

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

string * __thiscall
ValidationState<BlockValidationResult>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState<BlockValidationResult> *this)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_mode == M_VALID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Valid",(allocator<char> *)&local_40);
  }
  else {
    if ((this->m_debug_message)._M_string_length == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_reject_reason);
        return __return_storage_ptr__;
      }
      goto LAB_001c1004;
    }
    std::operator+(&local_40,&this->m_reject_reason,", ");
    std::operator+(__return_storage_ptr__,&local_40,&this->m_debug_message);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_001c1004:
  __stack_chk_fail();
}

Assistant:

std::string ToString() const
    {
        if (IsValid()) {
            return "Valid";
        }

        if (!m_debug_message.empty()) {
            return m_reject_reason + ", " + m_debug_message;
        }

        return m_reject_reason;
    }